

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxBoundFlippingRT<double>::selectEnter
          (SPxBoundFlippingRT<double> *this,double *val,int leaveIdx,bool polish)

{
  bool bVar1;
  byte bVar2;
  Representation RVar3;
  DataKey DVar4;
  double *pdVar5;
  UpdateVector<double> *pUVar6;
  SSVectorBase<double> *pSVar7;
  Breakpoint *pBVar8;
  Breakpoint *pBVar9;
  double *pdVar10;
  BreakpointCompare this_00;
  SPxBasisBase<double> *pSVar11;
  element_type *this_01;
  undefined8 uVar12;
  undefined1 in_CL;
  undefined4 in_EDX;
  SPxBoundFlippingRT<double> *in_RSI;
  SPxBoundFlippingRT<double> *in_RDI;
  double dVar17;
  Real RVar18;
  double *pdVar19;
  Real RVar20;
  int *in_stack_00000078;
  SPxBoundFlippingRT<double> *in_stack_00000080;
  int idx_2;
  int idx_1;
  bool foundStable;
  double lowstab;
  double x_1;
  double x;
  int idx;
  double stableDelta;
  double bestDelta;
  int bestBp;
  int stableBp;
  double absupd_1;
  double absupd;
  int i;
  int sortsize;
  int sorted;
  BreakpointCompare compare;
  bool instable;
  double stab;
  double degeneps;
  int npassedBp;
  int nBp;
  double slope;
  SPxId enterId;
  double moststable;
  Breakpoint tmp;
  int minIdx;
  double max;
  double *ucb;
  double *lcb;
  int cupdnnz;
  int *cidx;
  double *cupd;
  double *cvec;
  double *upb;
  double *lpb;
  int pupdnnz;
  int *pidx;
  double *pupd;
  double *pvec;
  SPxRatioTester<double> *pSVar21;
  int i_00;
  SPxSolverBase<double> *this_02;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  VectorBase<double> *in_stack_fffffffffffffe38;
  SVectorBase<double> *in_stack_fffffffffffffe40;
  pointer local_1b8;
  pointer local_1b0;
  SVectorBase<double> *in_stack_fffffffffffffe58;
  double *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 uVar22;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  double *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int *in_stack_fffffffffffffeb8;
  BreakpointSource BVar23;
  int *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar24;
  double local_128;
  double *in_stack_fffffffffffffee0;
  double dVar25;
  undefined4 in_stack_fffffffffffffee8;
  int iVar26;
  undefined4 in_stack_fffffffffffffeec;
  int iVar27;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  BreakpointSource in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff0b;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int iVar28;
  undefined4 in_stack_ffffffffffffff14;
  int iVar29;
  BreakpointCompare in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Breakpoint *in_stack_ffffffffffffff28;
  int local_c8;
  int local_c4;
  DataKey local_b8;
  Real local_b0;
  double local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  _func_int **local_90;
  SPxSolverBase<double> *local_88;
  SPxRatioTester<double> *local_80;
  int local_74;
  int *local_70;
  double *local_68;
  SPxRatioTester<double> *local_60;
  SPxSolverBase<double> *local_58;
  SPxRatioTester<double> *local_50;
  int local_44;
  int *local_40;
  double *local_38;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar30;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  
  uVar30 = CONCAT13(in_CL,in_stack_ffffffffffffffd8) & 0x1ffffff;
  if (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->leaveCount % 100
      == 0) {
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[38],_0>
              (in_RDI,(char (*) [38])"DLBFRT06 resetting long step history\n");
    in_RDI->flipPotential = 1.0;
  }
  if ((((((in_RDI->super_SPxFastRT<double>).field_0x51 & 1) == 0) || ((uVar30 & 0x1000000) != 0)) ||
      (RVar3 = SPxSolverBase<double>::rep
                         ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver),
      RVar3 == ROW)) || (in_RDI->flipPotential <= 0.0)) {
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[39],_0>
              (in_RDI,(char (*) [39])"DLBFRT07 switching to fast ratio test\n");
    DVar4 = (DataKey)SPxFastRT<double>::selectEnter
                               ((SPxFastRT<double> *)in_stack_ffffffffffffff18.entry,
                                (double *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff0c,(bool)in_stack_ffffffffffffff0b);
    uVar16._0_4_ = DVar4.info;
    uVar16._4_4_ = DVar4.idx;
    return (SPxId)uVar16;
  }
  SPxSolverBase<double>::pVec
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pdVar5 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7e1c);
  pUVar6 = SPxSolverBase<double>::pVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar6);
  local_38 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2f7e48);
  pUVar6 = SPxSolverBase<double>::pVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pSVar7 = UpdateVector<double>::delta(pUVar6);
  local_40 = SSVectorBase<double>::indexMem(pSVar7);
  pUVar6 = SPxSolverBase<double>::pVec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar6);
  local_44 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2f7ea0);
  SPxSolverBase<double>::lpBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  local_50 = (SPxRatioTester<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7ec2);
  SPxSolverBase<double>::upBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  local_58 = (SPxSolverBase<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7ee6);
  SPxSolverBase<double>::coPvec
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  local_60 = (SPxRatioTester<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7f0a);
  pUVar6 = SPxSolverBase<double>::coPvec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar6);
  local_68 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2f7f36);
  pUVar6 = SPxSolverBase<double>::coPvec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pSVar7 = UpdateVector<double>::delta(pUVar6);
  local_70 = SSVectorBase<double>::indexMem(pSVar7);
  pUVar6 = SPxSolverBase<double>::coPvec
                     ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  UpdateVector<double>::delta(pUVar6);
  local_74 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2f7f8e);
  SPxSolverBase<double>::lcBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  local_80 = (SPxRatioTester<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7fb0);
  SPxSolverBase<double>::ucBound
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  local_88 = (SPxSolverBase<double> *)
             VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f7fd4);
  SPxId::SPxId((SPxId *)0x2f7fe9);
  local_90 = (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester;
  (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester =
       (_func_int **)0x0;
  local_b0 = 0.0;
  local_c4 = 0;
  local_94 = 0xffffffff;
  if ((double)local_90 <= 0.0) {
    collectBreakpointsMin
              ((SPxBoundFlippingRT<double> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef8);
    pSVar21 = local_60;
    this_02 = local_88;
    collectBreakpointsMin
              ((SPxBoundFlippingRT<double> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef8);
  }
  else {
    collectBreakpointsMax
              ((SPxBoundFlippingRT<double> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef8);
    pSVar21 = local_60;
    this_02 = local_88;
    collectBreakpointsMax
              ((SPxBoundFlippingRT<double> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffee0,
               (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef8);
  }
  if (local_c4 == 0) {
    (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = local_90;
    uVar15._0_4_ = local_b8.info;
    uVar15._4_4_ = local_b8.idx;
    return (SPxId)uVar15;
  }
  pBVar8 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                     ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                      (int)((ulong)pSVar21 >> 0x20));
  local_a8 = pBVar8->val;
  local_a0._0_4_ = pBVar8->idx;
  local_a0._4_4_ = pBVar8->src;
  pBVar8 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                     ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                      (int)((ulong)pSVar21 >> 0x20));
  pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                     ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                      (int)((ulong)pSVar21 >> 0x20));
  pBVar9->val = pBVar8->val;
  BVar23 = pBVar8->src;
  pBVar9->idx = pBVar8->idx;
  pBVar9->src = BVar23;
  pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                     ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                      (int)((ulong)pSVar21 >> 0x20));
  pBVar9->val = local_a8;
  pBVar9->idx = (undefined4)local_a0;
  pBVar9->src = local_a0._4_4_;
  SPxSolverBase<double>::fTest
            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  pdVar10 = VectorBase<double>::operator[]
                      ((VectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
  dVar17 = spxAbs<double>(*pdVar10);
  if ((dVar17 == 0.0) && (!NAN(dVar17))) {
    dVar17 = spxAbs<double>(((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                            thesolver)->instableLeaveVal);
  }
  BreakpointCompare::BreakpointCompare((BreakpointCompare *)&stack0xffffffffffffff18);
  this_00.entry =
       Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_const_ptr
                 ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f8333);
  iVar29 = 0;
  iVar28 = 4;
  for (local_c8 = 0; uVar22 = local_c8 < local_c4 && 0.0 < dVar17,
      local_c8 < local_c4 && 0.0 < dVar17; local_c8 = local_c8 + 1) {
    if (iVar29 < local_c8) {
      Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_ptr
                ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f83b7);
      pSVar21 = (SPxRatioTester<double> *)((ulong)pSVar21 & 0xffffffff00000000);
      this_02 = (SPxSolverBase<double> *)CONCAT44((int)((ulong)this_02 >> 0x20),1);
      iVar29 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         (in_stack_ffffffffffffff28,
                          (BreakpointCompare *)
                          CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                          (int)((ulong)this_00.entry >> 0x20),(int)this_00.entry,iVar29,iVar28,
                          SUB84(dVar17,0),SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
    }
    pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                        (int)((ulong)pSVar21 >> 0x20));
    in_stack_ffffffffffffff0c = pBVar9->idx;
    pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                        (int)((ulong)pSVar21 >> 0x20));
    iVar27 = (int)((ulong)pSVar21 >> 0x20);
    if (pBVar9->src == PVEC) {
      bVar1 = SPxSolverBase<double>::isBasic(this_02,iVar27);
      if (bVar1) {
        pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                            (int)((ulong)pSVar21 >> 0x20));
        pBVar9->idx = -1;
        pUVar6 = SPxSolverBase<double>::pVec
                           ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           );
        UpdateVector<double>::delta(pUVar6);
        SSVectorBase<double>::clearIdx
                  ((SSVectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
      }
      else {
        RVar20 = spxAbs<double>(local_38[in_stack_ffffffffffffff0c]);
        pdVar10 = SPxLPBase<double>::upper
                            (&this_02->super_SPxLPBase<double>,(int)((ulong)pSVar21 >> 0x20));
        in_stack_fffffffffffffe70 = *pdVar10 * RVar20;
        pdVar10 = SPxLPBase<double>::lower
                            (&this_02->super_SPxLPBase<double>,(int)((ulong)pSVar21 >> 0x20));
        dVar17 = dVar17 - (in_stack_fffffffffffffe70 - *pdVar10 * RVar20);
        if (local_b0 < RVar20) {
          local_b0 = RVar20;
        }
      }
    }
    else {
      bVar1 = SPxSolverBase<double>::isCoBasic(this_02,iVar27);
      if (bVar1) {
        pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                            (int)((ulong)pSVar21 >> 0x20));
        pBVar9->idx = -1;
        pUVar6 = SPxSolverBase<double>::coPvec
                           ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           );
        UpdateVector<double>::delta(pUVar6);
        SSVectorBase<double>::clearIdx
                  ((SSVectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
      }
      else {
        RVar20 = spxAbs<double>(local_68[in_stack_ffffffffffffff0c]);
        pdVar10 = SPxLPBase<double>::rhs
                            (&this_02->super_SPxLPBase<double>,(int)((ulong)pSVar21 >> 0x20));
        in_stack_fffffffffffffe68 = (double *)(*pdVar10 * RVar20);
        pdVar10 = SPxLPBase<double>::lhs
                            (&this_02->super_SPxLPBase<double>,(int)((ulong)pSVar21 >> 0x20));
        dVar17 = dVar17 - ((double)in_stack_fffffffffffffe68 - *pdVar10 * RVar20);
        if (local_b0 < RVar20) {
          local_b0 = RVar20;
        }
      }
    }
  }
  local_c8 = local_c8 + -1;
  pdVar10 = &(in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta;
  if ((*pdVar10 <= dVar17 && dVar17 != *pdVar10) && (local_c4 + -1 <= local_c8)) {
    pSVar11 = SPxSolverBase<double>::basis
                        ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
    SPxBasisBase<double>::iteration(pSVar11);
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[42],_int,_0>
              (in_RDI,(char (*) [42])"DLBFRT02 {}: unboundedness in ratio test\n",
               (int *)&stack0xfffffffffffffef4);
    in_RDI->flipPotential = in_RDI->flipPotential - 0.5;
    (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = local_90;
    DVar4 = (DataKey)SPxFastRT<double>::selectEnter
                               ((SPxFastRT<double> *)this_00.entry,(double *)CONCAT44(iVar29,iVar28)
                                ,in_stack_ffffffffffffff0c,(bool)in_stack_ffffffffffffff0b);
    uVar14._0_4_ = DVar4.info;
    uVar14._4_4_ = DVar4.idx;
    return (SPxId)uVar14;
  }
  pSVar11 = SPxSolverBase<double>::basis
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  SPxBasisBase<double>::iteration(pSVar11);
  SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[44],_int,_int_&,_0>
            (in_RDI,(char (*) [44])"DLBFRT01 {}: number of flip candidates: {}\n",
             (int *)&stack0xfffffffffffffef0,&local_c8);
  iVar26 = -1;
  pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                     ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                      (int)((ulong)pSVar21 >> 0x20));
  dVar25 = pBVar9->val;
  iVar27 = local_c8;
LAB_002f880f:
  do {
    iVar27 = iVar27 + 1;
    if (local_c4 <= iVar27) break;
    local_128 = 0.0;
    if (iVar29 < iVar27) {
      Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::get_ptr
                ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2f8850);
      pSVar21 = (SPxRatioTester<double> *)((ulong)pSVar21 & 0xffffffff00000000);
      this_02 = (SPxSolverBase<double> *)CONCAT44((int)((ulong)this_02 >> 0x20),1);
      iVar29 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         (in_stack_ffffffffffffff28,
                          (BreakpointCompare *)
                          CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                          (int)((ulong)this_00.entry >> 0x20),(int)this_00.entry,iVar29,iVar28,
                          SUB84(dVar17,0),SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
    }
    pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                        (int)((ulong)pSVar21 >> 0x20));
    iVar24 = pBVar9->idx;
    pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                        (int)((ulong)pSVar21 >> 0x20));
    i_00 = (int)((ulong)pSVar21 >> 0x20);
    if (pBVar9->src == PVEC) {
      bVar1 = SPxSolverBase<double>::isBasic(this_02,i_00);
      if (bVar1) {
        pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                            (int)((ulong)pSVar21 >> 0x20));
        pBVar9->idx = -1;
        pUVar6 = SPxSolverBase<double>::pVec
                           ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           );
        UpdateVector<double>::delta(pUVar6);
        SSVectorBase<double>::clearIdx
                  ((SSVectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
        goto LAB_002f880f;
      }
      RVar20 = local_38[iVar24];
      RVar18 = spxAbs<double>(RVar20);
      if (local_b0 < RVar18) {
        in_stack_fffffffffffffe58 =
             SPxSolverBase<double>::vector(this_02,(int)((ulong)pSVar21 >> 0x20));
        SPxSolverBase<double>::coPvec
                  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
        in_stack_fffffffffffffe60 =
             (double *)
             SVectorBase<double>::operator*(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        SPxSolverBase<double>::pVec
                  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
        *pdVar10 = (double)in_stack_fffffffffffffe60;
        if (RVar20 <= 0.0) {
          local_1b0 = (pointer)(&local_50->_vptr_SPxRatioTester)[iVar24];
        }
        else {
          local_1b0 = (pointer)(&(local_58->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                 super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                                 _vptr_ClassArray)[iVar24];
        }
        local_128 = ((double)local_1b0 - pdVar5[iVar24]) / RVar20;
        if (local_128 <= dVar25) {
          iVar26 = iVar27;
          local_b0 = spxAbs<double>(RVar20);
          iVar27 = iVar26;
        }
      }
    }
    else {
      bVar1 = SPxSolverBase<double>::isCoBasic(this_02,i_00);
      if (bVar1) {
        pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                            (int)((ulong)pSVar21 >> 0x20));
        pBVar9->idx = -1;
        pUVar6 = SPxSolverBase<double>::coPvec
                           ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           );
        UpdateVector<double>::delta(pUVar6);
        SSVectorBase<double>::clearIdx
                  ((SSVectorBase<double> *)this_02,(int)((ulong)pSVar21 >> 0x20));
        goto LAB_002f880f;
      }
      in_stack_fffffffffffffec0 = (int *)local_68[iVar24];
      RVar20 = spxAbs<double>((Real)in_stack_fffffffffffffec0);
      if (local_b0 < RVar20) {
        if ((double)in_stack_fffffffffffffec0 <= 0.0) {
          local_1b8 = (pointer)(&local_80->_vptr_SPxRatioTester)[iVar24];
        }
        else {
          local_1b8 = (pointer)(&(local_88->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                 super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                                 _vptr_ClassArray)[iVar24];
        }
        local_128 = ((double)local_1b8 - (double)(&local_60->_vptr_SPxRatioTester)[iVar24]) /
                    (double)in_stack_fffffffffffffec0;
        if (local_128 <= dVar25) {
          iVar26 = iVar27;
          local_b0 = spxAbs<double>((Real)in_stack_fffffffffffffec0);
          iVar27 = iVar26;
        }
      }
    }
  } while (local_128 <=
           (in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + dVar25);
  bVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableLeave
          & 1;
  SPxRatioTester<double>::tolerances(pSVar21);
  this_01 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2f8cb6);
  pdVar19 = (double *)Tolerances::scaleAccordingToEpsilon(this_01,1e-10);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f8cd9);
  pdVar10 = pdVar19;
  if ((bVar2 & 1) == 0) {
    pdVar19 = (double *)SPxFastRT<double>::minStability(&in_RDI->super_SPxFastRT<double>,local_b0);
  }
  BVar23 = (BreakpointSource)in_stack_fffffffffffffec0;
  iVar28 = (int)((ulong)pBVar8 >> 0x20);
  iVar29 = (int)((ulong)pSVar21 >> 0x20);
  in_stack_fffffffffffffea4 = in_stack_fffffffffffffea4 & 0xffffff;
  if (iVar26 < 0) {
    while( true ) {
      iVar29 = (int)((ulong)pSVar21 >> 0x20);
      bVar1 = (in_stack_fffffffffffffea4 & 0x1000000) == 0;
      in_stack_fffffffffffffe37 = bVar1 && -1 < local_c8;
      if (!bVar1 || -1 >= local_c8) break;
      pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                         ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,iVar29);
      iVar29 = pBVar9->idx;
      if (-1 < iVar29) {
        pBVar9 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,
                            (int)((ulong)pSVar21 >> 0x20));
        iVar28 = (int)((ulong)pBVar8 >> 0x20);
        if (pBVar9->src == PVEC) {
          pSVar21 = local_50;
          this_02 = local_58;
          bVar1 = getData((SPxBoundFlippingRT<double> *)CONCAT44(iVar29,in_stack_fffffffffffffe98),
                          (double *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (SPxId *)in_RDI,iVar28,(double)CONCAT17(uVar22,in_stack_fffffffffffffe78),
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          in_stack_fffffffffffffe60,
                          (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          pdVar10,(BreakpointSource)in_stack_fffffffffffffec0,
                          (double)in_stack_fffffffffffffe58);
          in_stack_fffffffffffffea4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
        }
        else {
          pSVar21 = local_80;
          this_02 = local_88;
          bVar1 = getData((SPxBoundFlippingRT<double> *)CONCAT44(iVar29,in_stack_fffffffffffffe98),
                          (double *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (SPxId *)in_RDI,iVar28,(double)CONCAT17(uVar22,in_stack_fffffffffffffe78),
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          in_stack_fffffffffffffe60,
                          (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          pdVar10,(BreakpointSource)in_stack_fffffffffffffec0,
                          (double)in_stack_fffffffffffffe58);
          in_stack_fffffffffffffea4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
        }
      }
      local_c8 = local_c8 + -1;
    }
    local_c8 = local_c8 + 1;
  }
  else if ((double)pdVar19 < local_b0) {
    pBVar8 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,iVar29);
    in_stack_fffffffffffffea0 = pBVar8->idx;
    pBVar8 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,iVar29);
    if (pBVar8->src == PVEC) {
      pSVar21 = local_50;
      this_02 = local_58;
      bVar1 = getData((SPxBoundFlippingRT<double> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (double *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (SPxId *)in_RDI,iVar28,(double)CONCAT17(uVar22,in_stack_fffffffffffffe78),
                      in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                      (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      pdVar10,BVar23,(double)in_stack_fffffffffffffe58);
      iVar29 = (int)((ulong)pSVar21 >> 0x20);
      in_stack_fffffffffffffea4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
    }
    else {
      pSVar21 = local_80;
      this_02 = local_88;
      bVar1 = getData((SPxBoundFlippingRT<double> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (double *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      (SPxId *)in_RDI,iVar28,(double)CONCAT17(uVar22,in_stack_fffffffffffffe78),
                      in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                      (double *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      pdVar10,BVar23,(double)in_stack_fffffffffffffe58);
      iVar29 = (int)((ulong)pSVar21 >> 0x20);
      in_stack_fffffffffffffea4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
    }
  }
  if ((in_stack_fffffffffffffea4 & 0x1000000) == 0) {
    if (in_RDI->relax_count < 2) {
      pSVar11 = SPxSolverBase<double>::basis
                          ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
      ;
      SPxBasisBase<double>::iteration(pSVar11);
      SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[51],_int,_0>
                (in_RDI,(char (*) [51])"DLBFRT04 {}: no valid enterId found - relaxing...\n",
                 (int *)&stack0xfffffffffffffe98);
      SPxFastRT<double>::relax
                ((SPxFastRT<double> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30))
      ;
      in_RDI->relax_count = in_RDI->relax_count + 1;
      (in_RSI->super_SPxFastRT<double>).super_SPxRatioTester<double>._vptr_SPxRatioTester = local_90
      ;
      DVar4 = (DataKey)selectEnter(in_RSI,(double *)CONCAT44(in_EDX,uVar30),
                                   (int)((ulong)pdVar5 >> 0x20),SUB81((ulong)pdVar5 >> 0x18,0));
      uVar13._0_4_ = DVar4.info;
      uVar13._4_4_ = DVar4.idx;
      return (SPxId)uVar13;
    }
    pSVar11 = SPxSolverBase<double>::basis
                        ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
    SPxBasisBase<double>::iteration(pSVar11);
    SPxOut::debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[51],_int,_0>
              (in_RDI,(char (*) [51])"DLBFRT05 {}: no valid enterId found - breaking...\n",
               (int *)&stack0xfffffffffffffe94);
    uVar12._0_4_ = local_b8.info;
    uVar12._4_4_ = local_b8.idx;
    return (SPxId)uVar12;
  }
  in_RDI->relax_count = 0;
  SPxFastRT<double>::tighten
            ((SPxFastRT<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (0 < local_c8) {
    pBVar8 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)this_02,iVar29);
    RVar20 = spxAbs<double>(pBVar8->val);
    pdVar5 = &(in_RDI->super_SPxFastRT<double>).fastDelta;
    if (*pdVar5 <= RVar20 && RVar20 != *pdVar5) {
      flipAndUpdate(in_stack_00000080,in_stack_00000078);
      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           local_c8;
      if (local_c8 < 10) {
        in_RDI->flipPotential = in_RDI->flipPotential - 0.05;
      }
      else {
        in_RDI->flipPotential = 1.0;
      }
      goto LAB_002f9226;
    }
  }
  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
  in_RDI->flipPotential = in_RDI->flipPotential - 0.1;
LAB_002f9226:
  pSVar11 = SPxSolverBase<double>::basis
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
  SPxBasisBase<double>::iteration(pSVar11);
  SPxOut::
  debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[55],_int,_soplex::SPxId_&,_int_&,_0>
            (in_RDI,(char (*) [55])"DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
             (int *)&stack0xfffffffffffffe90,(SPxId *)&local_b8,&local_c4);
  return (SPxId)local_b8;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}